

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_generator.cc
# Opt level: O0

bool __thiscall
re2::RegexpGenerator::GenerateRandomPostfix
          (RegexpGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *post,int nstk,int ops,int atoms)

{
  ACMRandom *pAVar1;
  bool bVar2;
  int32 iVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  bool ret_1;
  bool ret;
  int nargs;
  string *fmt;
  int atoms_local;
  int ops_local;
  int nstk_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *post_local;
  RegexpGenerator *this_local;
  
  while ((nstk != 1 ||
         (iVar3 = ACMRandom::Uniform(this->acm_,(this->maxatoms_ + 1) - atoms), iVar3 != 0))) {
    if (this->maxops_ < ops + nstk + -1) {
      return false;
    }
    if ((ops < this->maxops_) && (iVar3 = ACMRandom::Uniform(this->acm_,2), iVar3 == 0)) {
      pAVar1 = this->acm_;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->ops_);
      iVar3 = ACMRandom::Uniform(pAVar1,(int32)sVar5);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->ops_,(long)iVar3);
      iVar4 = CountArgs(pvVar6);
      if (iVar4 <= nstk) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(post,pvVar6);
        bVar2 = GenerateRandomPostfix(this,post,(nstk - iVar4) + 1,ops + 1,atoms);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(post);
        if (bVar2) {
          return true;
        }
      }
    }
    if ((atoms < this->maxatoms_) && (iVar3 = ACMRandom::Uniform(this->acm_,2), iVar3 == 0)) {
      pAVar1 = this->acm_;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->atoms_);
      iVar3 = ACMRandom::Uniform(pAVar1,(int32)sVar5);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->atoms_,(long)iVar3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(post,pvVar6);
      bVar2 = GenerateRandomPostfix(this,post,nstk + 1,ops,atoms + 1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(post);
      if (bVar2) {
        return true;
      }
    }
  }
  RunPostfix(this,post);
  return true;
}

Assistant:

bool RegexpGenerator::GenerateRandomPostfix(vector<string>* post, int nstk,
                                            int ops, int atoms) {
  for (;;) {
    // Stop if we get to a single element, but only sometimes.
    if (nstk == 1 && acm_->Uniform(maxatoms_ + 1 - atoms) == 0) {
      RunPostfix(*post);
      return true;
    }

    // Early out: if used too many operators or can't
    // get back down to a single expression on the stack
    // using binary operators, give up.
    if (ops + nstk - 1 > maxops_)
      return false;

    // Add operators if there are enough arguments.
    if (ops < maxops_ && acm_->Uniform(2) == 0) {
      const string& fmt = ops_[acm_->Uniform(static_cast<int32>(ops_.size()))];
      int nargs = CountArgs(fmt);
      if (nargs <= nstk) {
        post->push_back(fmt);
        bool ret = GenerateRandomPostfix(post, nstk - nargs + 1,
                                         ops + 1, atoms);
        post->pop_back();
        if (ret)
          return true;
      }
    }

    // Add atoms if there is room.
    if (atoms < maxatoms_ && acm_->Uniform(2) == 0) {
      post->push_back(atoms_[acm_->Uniform(static_cast<int32>(atoms_.size()))]);
      bool ret = GenerateRandomPostfix(post, nstk + 1, ops, atoms + 1);
      post->pop_back();
      if (ret)
        return true;
    }
  }
}